

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateMembers
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableStringFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"private volatile java.lang.Object $name$_;\n");
  PrintExtraFieldInfo(&this->variables_,printer);
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_message$;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public java.lang.String get$capitalized_name$() {\n  java.lang.Object ref = $name$_;\n  if (ref instanceof java.lang.String) {\n    return (java.lang.String) ref;\n  } else {\n    com.google.protobuf.ByteString bs = \n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n"
                    );
  bVar1 = CheckUtf8(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"    $name$_ = s;\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "    if (bs.isValidUtf8()) {\n      $name$_ = s;\n    }\n");
  }
  io::Printer::Print(printer,&this->variables_,"    return s;\n  }\n}\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public com.google.protobuf.ByteString\n    get$capitalized_name$Bytes() {\n  java.lang.Object ref = $name$_;\n  if (ref instanceof java.lang.String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    $name$_ = b;\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringFieldGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private volatile java.lang.Object $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);

  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_message$;\n"
      "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.lang.String get$capitalized_name$() {\n"
    "  java.lang.Object ref = $name$_;\n"
    "  if (ref instanceof java.lang.String) {\n"
    "    return (java.lang.String) ref;\n"
    "  } else {\n"
    "    com.google.protobuf.ByteString bs = \n"
    "        (com.google.protobuf.ByteString) ref;\n"
      "    java.lang.String s = bs.toStringUtf8();\n");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "    $name$_ = s;\n");
  } else {
    printer->Print(variables_,
      "    if (bs.isValidUtf8()) {\n"
      "      $name$_ = s;\n"
      "    }\n");
  }
  printer->Print(variables_,
    "    return s;\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes() {\n"
    "  java.lang.Object ref = $name$_;\n"
    "  if (ref instanceof java.lang.String) {\n"
    "    com.google.protobuf.ByteString b = \n"
    "        com.google.protobuf.ByteString.copyFromUtf8(\n"
    "            (java.lang.String) ref);\n"
    "    $name$_ = b;\n"
    "    return b;\n"
    "  } else {\n"
    "    return (com.google.protobuf.ByteString) ref;\n"
    "  }\n"
    "}\n");
}